

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

void Ssw_MatchingStart(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs)

{
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  Aig_Man_t *pAVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  Aig_Man_t *pAVar12;
  Aig_Man_t *pAVar13;
  
  Aig_ManCleanData(p0);
  pAVar13 = p1;
  Aig_ManCleanData(p1);
  iVar4 = vPairs->nSize;
  if (0 < iVar4) {
    lVar3 = 1;
    do {
      pVVar1 = p0->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        uVar5 = vPairs->pArray[lVar3 + -1];
        pAVar13 = (Aig_Man_t *)(ulong)uVar5;
        if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_0061a177;
        pvVar8 = pVVar1->pArray[(long)pAVar13];
      }
      if (iVar4 <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pVVar1 = p1->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar5 = vPairs->pArray[lVar3];
        if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_0061a177;
        pvVar6 = pVVar1->pArray[uVar5];
      }
      if (*(long *)((long)pvVar8 + 0x28) != 0) {
        __assert_fail("pObj0->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x4b,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      if (*(long *)((long)pvVar6 + 0x28) != 0) {
        __assert_fail("pObj1->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x4c,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      *(void **)((long)pvVar8 + 0x28) = pvVar6;
      *(void **)((long)pvVar6 + 0x28) = pvVar8;
      iVar4 = vPairs->nSize;
      iVar10 = (int)lVar3;
      lVar3 = lVar3 + 2;
    } while (iVar10 + 1 < iVar4);
  }
  if ((Aig_Obj_t *)(p0->pConst1->field_5).pData != p1->pConst1) {
    __assert_fail("pObj0->pData == pObj1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                  ,0x53,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
  }
  if ((Aig_Obj_t *)(p1->pConst1->field_5).pData != p0->pConst1) {
    __assert_fail("pObj1->pData == pObj0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                  ,0x54,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
  }
  if (0 < (long)p0->nTruePis) {
    uVar5 = p0->vCis->nSize;
    uVar11 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar11;
    }
    do {
      if ((uVar9 == uVar11) || ((long)p1->vCis->nSize <= (long)uVar11)) goto LAB_0061a177;
      pVVar1 = (Vec_Ptr_t *)p0->vCis->pArray[uVar11];
      pAVar13 = (Aig_Man_t *)p1->vCis->pArray[uVar11];
      if ((Aig_Man_t *)pVVar1[2].pArray != pAVar13) {
        __assert_fail("pObj0->pData == pObj1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x59,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      if (pAVar13->vBufs != pVVar1) {
        __assert_fail("pObj1->pData == pObj0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x5a,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      uVar11 = uVar11 + 1;
    } while ((long)p0->nTruePis != uVar11);
  }
  pAVar7 = (Aig_Man_t *)(long)p0->vCos->nSize;
  if (0 < (long)pAVar7) {
    uVar5 = p1->vCos->nSize;
    pAVar13 = (Aig_Man_t *)0x0;
    pAVar12 = (Aig_Man_t *)(ulong)uVar5;
    if ((int)uVar5 < 1) {
      pAVar12 = pAVar13;
    }
    do {
      if (pAVar12 == pAVar13) goto LAB_0061a177;
      if (*(long *)((long)p0->vCos->pArray[(long)pAVar13] + 0x28) != 0) {
        __assert_fail("pObj0->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x60,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      if (*(long *)((long)p1->vCos->pArray[(long)pAVar13] + 0x28) != 0) {
        __assert_fail("pObj1->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x61,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      pAVar13 = (Aig_Man_t *)((long)&pAVar13->pName + 1);
    } while (pAVar7 != pAVar13);
  }
  iVar4 = p0->nRegs;
  if (0 < iVar4) {
    iVar10 = 0;
    do {
      uVar5 = p0->nTruePis + iVar10;
      if (((int)uVar5 < 0) || (p0->vCis->nSize <= (int)uVar5)) goto LAB_0061a177;
      piVar2 = *(int **)((long)p0->vCis->pArray[uVar5] + 0x28);
      if ((piVar2 != (int *)0x0) && (((piVar2[6] & 7U) != 2 || (*piVar2 < p1->nTruePis)))) {
        Abc_Print((int)pAVar13,"Mismatch between LO pairs.\n");
        iVar4 = p0->nRegs;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar4);
  }
  iVar4 = p1->nRegs;
  if (0 < iVar4) {
    iVar10 = 0;
    do {
      uVar5 = p1->nTruePis + iVar10;
      if (((int)uVar5 < 0) || (p1->vCis->nSize <= (int)uVar5)) {
LAB_0061a177:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar2 = *(int **)((long)p1->vCis->pArray[uVar5] + 0x28);
      if ((piVar2 != (int *)0x0) && (((piVar2[6] & 7U) != 2 || (*piVar2 < p0->nTruePis)))) {
        Abc_Print((int)pAVar13,"Mismatch between LO pairs.\n");
        iVar4 = p1->nRegs;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar4);
  }
  return;
}

Assistant:

void Ssw_MatchingStart( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairs, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairs, i+1) );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // make sure constants are matched
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    assert( pObj0->pData == pObj1 );
    assert( pObj1->pData == pObj0 );
    // make sure PIs are matched
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        assert( pObj0->pData == pObj1 );
        assert( pObj1->pData == pObj0 );
    }
    // make sure the POs are not matched
    Aig_ManForEachCo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
    }

    // check that LIs/LOs are matched in sync
    Saig_ManForEachLo( p0, pObj0, i )
    {
        if ( pObj0->pData == NULL )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        if ( !Saig_ObjIsLo(p1, pObj1) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
    Saig_ManForEachLo( p1, pObj1, i )
    {
        if ( pObj1->pData == NULL )
            continue;
        pObj0 = (Aig_Obj_t *)pObj1->pData;
        if ( !Saig_ObjIsLo(p0, pObj0) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
}